

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_pointgrid.cpp
# Opt level: O3

ON_PointGrid * __thiscall ON_PointGrid::operator=(ON_PointGrid *this,ON_PointGrid *src)

{
  double *pdVar1;
  uint uVar2;
  ON_3dPoint *pOVar3;
  ON_3dPoint *pOVar4;
  double dVar5;
  long lVar6;
  ulong uVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  
  if (this != src) {
    ON_Object::operator=((ON_Object *)this,(ON_Object *)src);
    iVar8 = src->m_point_count[0];
    this->m_point_count[0] = iVar8;
    uVar2 = src->m_point_count[1];
    this->m_point_count[1] = uVar2;
    this->m_point_stride0 = uVar2;
    uVar9 = uVar2 * iVar8;
    uVar11 = (this->m_point).super_ON_SimpleArray<ON_3dPoint>.m_capacity;
    if (uVar11 < uVar9) {
      ON_SimpleArray<ON_3dPoint>::SetCapacity
                (&(this->m_point).super_ON_SimpleArray<ON_3dPoint>,(long)(int)uVar9);
      iVar8 = this->m_point_count[0];
      uVar2 = this->m_point_count[1];
      uVar11 = (this->m_point).super_ON_SimpleArray<ON_3dPoint>.m_capacity;
      uVar9 = uVar2 * iVar8;
    }
    uVar7 = (ulong)uVar2;
    if ((-1 < (int)uVar9) && ((int)uVar9 <= (int)uVar11)) {
      (this->m_point).super_ON_SimpleArray<ON_3dPoint>.m_count = uVar9;
    }
    if (0 < (int)uVar9) {
      if (this->m_point_stride0 == src->m_point_stride0) {
        memcpy((this->m_point).super_ON_SimpleArray<ON_3dPoint>.m_a,
               (src->m_point).super_ON_SimpleArray<ON_3dPoint>.m_a,(ulong)uVar9 * 0x18);
      }
      else if (0 < iVar8) {
        iVar10 = 0;
        do {
          if (0 < (int)uVar7) {
            lVar12 = 0;
            lVar13 = 0;
            do {
              lVar6 = (long)src->m_point_stride0 * (long)iVar10;
              pOVar3 = (src->m_point).super_ON_SimpleArray<ON_3dPoint>.m_a;
              pOVar4 = (this->m_point).super_ON_SimpleArray<ON_3dPoint>.m_a;
              lVar14 = (long)this->m_point_stride0 * (long)iVar10 + lVar13;
              pOVar4[lVar14].z = *(double *)((long)&pOVar3[lVar6].z + lVar12);
              pdVar1 = (double *)((long)&pOVar3[lVar6].x + lVar12);
              dVar5 = pdVar1[1];
              pOVar4 = pOVar4 + lVar14;
              pOVar4->x = *pdVar1;
              pOVar4->y = dVar5;
              lVar13 = lVar13 + 1;
              uVar7 = (ulong)this->m_point_count[1];
              lVar12 = lVar12 + 0x18;
            } while (lVar13 < (long)uVar7);
            iVar8 = this->m_point_count[0];
          }
          iVar10 = iVar10 + 1;
        } while (iVar10 < iVar8);
      }
    }
  }
  return this;
}

Assistant:

ON_PointGrid& ON_PointGrid::operator=( const ON_PointGrid& src )
{
  if ( this != &src ) {
    ON_Geometry::operator=(src);
    m_point_count[0] = src.m_point_count[0];
    m_point_count[1] = src.m_point_count[1];
    m_point_stride0 = m_point_count[1];
    m_point.Reserve(PointCount());
    m_point.SetCount(PointCount());
    if ( PointCount() > 0 ) {
      // copy cv array
      if ( m_point_stride0 == src.m_point_stride0 ) {
        memcpy( m_point.Array(), src.m_point.Array(), PointCount()*sizeof(ON_3dPoint) );
      }
      else {
        int i, j;
        for ( i = 0; i < m_point_count[0]; i++ ) for ( j = 0; j < m_point_count[1]; j++ ) {
          m_point[i*m_point_stride0+j] = src[i][j];
        }
      }
    }
  }
  return *this;
}